

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cc
# Opt level: O3

void __thiscall xLearn::Checker::check_conflict_train(Checker *this,HyperParam *hyper_param)

{
  string *psVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  Modifier reset;
  Modifier bold;
  Modifier mag;
  Modifier local_4c;
  Modifier local_48;
  Modifier local_44;
  string local_40;
  
  if ((hyper_param->from_file == false) && (hyper_param->cross_validation == true)) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "Transform DMatrix not from file doesn\'t support cross-validation. xLearn has already disable the -cv option."
               ,"");
    local_48.code = BOLD;
    local_4c.code = RESET;
    local_44.code = FG_MAGENTA;
    poVar4 = Color::operator<<((ostream *)&std::cout,&local_44);
    poVar4 = Color::operator<<(poVar4,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ WARNING    ] ",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_40._M_dataplus._M_p,local_40._M_string_length);
    poVar4 = Color::operator<<(poVar4,&local_4c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    hyper_param->cross_validation = false;
  }
  bVar2 = hyper_param->cross_validation;
  if ((hyper_param->on_disk == true) && ((bVar2 & 1) != 0)) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "On-disk training doesn\'t support cross-validation. xLearn has already disable the -cv option."
               ,"");
    local_48.code = BOLD;
    local_4c.code = RESET;
    local_44.code = FG_MAGENTA;
    poVar4 = Color::operator<<((ostream *)&std::cout,&local_44);
    poVar4 = Color::operator<<(poVar4,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ WARNING    ] ",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_40._M_dataplus._M_p,local_40._M_string_length);
    poVar4 = Color::operator<<(poVar4,&local_4c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    hyper_param->cross_validation = false;
  }
  else {
    if (((bVar2 & 1) != 0) && (hyper_param->early_stop == true)) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "Cross-validation doesn\'t support early-stopping. xLearn has already close early-stopping."
                 ,"");
      local_48.code = BOLD;
      local_4c.code = RESET;
      local_44.code = FG_MAGENTA;
      poVar4 = Color::operator<<((ostream *)&std::cout,&local_44);
      poVar4 = Color::operator<<(poVar4,&local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ WARNING    ] ",0xf);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_40._M_dataplus._M_p,local_40._M_string_length);
      poVar4 = Color::operator<<(poVar4,&local_4c);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      hyper_param->early_stop = false;
      bVar2 = hyper_param->cross_validation;
    }
    if (((bVar2 & 1) != 0) && ((hyper_param->test_set_file)._M_string_length != 0)) {
      StringPrintf_abi_cxx11_
                (&local_40,
                 "The --cv (cross-validation) has been set, and xLearn will ignore the validation file: %s"
                 ,(hyper_param->test_set_file)._M_dataplus._M_p);
      local_48.code = BOLD;
      local_4c.code = RESET;
      local_44.code = FG_MAGENTA;
      poVar4 = Color::operator<<((ostream *)&std::cout,&local_44);
      poVar4 = Color::operator<<(poVar4,&local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ WARNING    ] ",0xf);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_40._M_dataplus._M_p,local_40._M_string_length);
      poVar4 = Color::operator<<(poVar4,&local_4c);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      (hyper_param->validate_set_file)._M_string_length = 0;
      *(hyper_param->validate_set_file)._M_dataplus._M_p = '\0';
      bVar2 = hyper_param->cross_validation;
    }
    if (((bVar2 & 1) != 0) && (hyper_param->quiet == true)) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "The --cv (cross-validation) has been set, and xLearn will ignore the --quiet option."
                 ,"");
      local_48.code = BOLD;
      local_4c.code = RESET;
      local_44.code = FG_MAGENTA;
      poVar4 = Color::operator<<((ostream *)&std::cout,&local_44);
      poVar4 = Color::operator<<(poVar4,&local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ WARNING    ] ",0xf);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_40._M_dataplus._M_p,local_40._M_string_length);
      poVar4 = Color::operator<<(poVar4,&local_4c);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      hyper_param->quiet = false;
      bVar2 = hyper_param->cross_validation;
    }
    if (((bVar2 & 1) != 0) && ((hyper_param->model_file)._M_string_length != 0)) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "The --cv (cross-validation) has been set, and xLearn will not dump model checkpoint to disk."
                 ,"");
      local_48.code = BOLD;
      local_4c.code = RESET;
      local_44.code = FG_MAGENTA;
      poVar4 = Color::operator<<((ostream *)&std::cout,&local_44);
      poVar4 = Color::operator<<(poVar4,&local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ WARNING    ] ",0xf);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_40._M_dataplus._M_p,local_40._M_string_length);
      poVar4 = Color::operator<<(poVar4,&local_4c);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      (hyper_param->model_file)._M_string_length = 0;
      *(hyper_param->model_file)._M_dataplus._M_p = '\0';
    }
  }
  if ((((hyper_param->validate_set_file)._M_string_length == 0) &&
      (hyper_param->valid_dataset == (DMatrix *)0x0)) && (hyper_param->early_stop == true)) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "Validation file(dataset) not found, xLearn has already disable early-stopping.","");
    local_48.code = BOLD;
    local_4c.code = RESET;
    local_44.code = FG_MAGENTA;
    poVar4 = Color::operator<<((ostream *)&std::cout,&local_44);
    poVar4 = Color::operator<<(poVar4,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ WARNING    ] ",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_40._M_dataplus._M_p,local_40._M_string_length);
    poVar4 = Color::operator<<(poVar4,&local_4c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    hyper_param->early_stop = false;
  }
  psVar1 = &hyper_param->metric;
  iVar3 = std::__cxx11::string::compare((char *)psVar1);
  if (((iVar3 != 0) && ((hyper_param->validate_set_file)._M_string_length == 0)) &&
     ((hyper_param->valid_dataset == (DMatrix *)0x0 && (hyper_param->cross_validation == false)))) {
    StringPrintf_abi_cxx11_
              (&local_40,"Validation file not found, xLearn has already disable (-x %s) option.",
               (psVar1->_M_dataplus)._M_p);
    local_48.code = BOLD;
    local_4c.code = RESET;
    local_44.code = FG_MAGENTA;
    poVar4 = Color::operator<<((ostream *)&std::cout,&local_44);
    poVar4 = Color::operator<<(poVar4,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ WARNING    ] ",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_40._M_dataplus._M_p,local_40._M_string_length);
    poVar4 = Color::operator<<(poVar4,&local_4c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(hyper_param->metric)._M_string_length,0x159281);
  }
  iVar3 = std::__cxx11::string::compare((char *)&hyper_param->loss_func);
  if (iVar3 == 0) {
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
    if (((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 != 0)) &&
       ((iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 != 0 &&
        (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 != 0)))) {
      return;
    }
    StringPrintf_abi_cxx11_
              (&local_40,
               "The -x: %s metric can only be used in classification tasks. xLearn will ignore this option."
               ,(psVar1->_M_dataplus)._M_p);
    local_48.code = BOLD;
    local_4c.code = RESET;
    local_44.code = FG_MAGENTA;
    poVar4 = Color::operator<<((ostream *)&std::cout,&local_44);
    poVar4 = Color::operator<<(poVar4,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ WARNING    ] ",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_40._M_dataplus._M_p,local_40._M_string_length);
    poVar4 = Color::operator<<(poVar4,&local_4c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&hyper_param->loss_func);
    if (iVar3 != 0) {
      return;
    }
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
    if ((((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 != 0)) &&
        (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 != 0)) &&
       (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 != 0)) {
      return;
    }
    StringPrintf_abi_cxx11_
              (&local_40,
               "The -x: %s metric can only be used in regression tasks. xLearn will ignore this option."
               ,(psVar1->_M_dataplus)._M_p);
    local_48.code = BOLD;
    local_4c.code = RESET;
    local_44.code = FG_MAGENTA;
    poVar4 = Color::operator<<((ostream *)&std::cout,&local_44);
    poVar4 = Color::operator<<(poVar4,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ WARNING    ] ",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_40._M_dataplus._M_p,local_40._M_string_length);
    poVar4 = Color::operator<<(poVar4,&local_4c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__cxx11::string::_M_replace
            ((ulong)psVar1,0,(char *)(hyper_param->metric)._M_string_length,0x159281);
  return;
}

Assistant:

void Checker::check_conflict_train(HyperParam& hyper_param) {
  if (!hyper_param.from_file && hyper_param.cross_validation) {
    Color::print_warning("Transform DMatrix not from file doesn't support cross-validation. "
                         "xLearn has already disable the -cv option.");
    hyper_param.cross_validation = false;
  }
  if (hyper_param.on_disk && hyper_param.cross_validation) {
    Color::print_warning("On-disk training doesn't support cross-validation. "
                         "xLearn has already disable the -cv option.");
    hyper_param.cross_validation = false;
  }
  if (hyper_param.cross_validation && hyper_param.early_stop) {
    Color::print_warning("Cross-validation doesn't support early-stopping. "
                         "xLearn has already close early-stopping.");
    hyper_param.early_stop = false;
  }
  if (hyper_param.cross_validation && !hyper_param.test_set_file.empty()) {
    Color::print_warning(
      StringPrintf("The --cv (cross-validation) has been set, and "
                   "xLearn will ignore the validation file: %s",
                   hyper_param.test_set_file.c_str())
    );
    hyper_param.validate_set_file.clear();
  }
  if (hyper_param.cross_validation && hyper_param.quiet) {
    Color::print_warning("The --cv (cross-validation) has been set, and "
                         "xLearn will ignore the --quiet option.");
    hyper_param.quiet = false;
  }
  if (hyper_param.cross_validation && !hyper_param.model_file.empty()) {
    Color::print_warning("The --cv (cross-validation) has been set, and "
                         "xLearn will not dump model checkpoint to disk.");
    hyper_param.model_file.clear();
  }
  if ((hyper_param.validate_set_file.empty() && hyper_param.valid_dataset == nullptr) 
      && hyper_param.early_stop) {
    Color::print_warning("Validation file(dataset) not found, xLearn has already "
                         "disable early-stopping.");
    hyper_param.early_stop = false;
  }
  if (hyper_param.metric.compare("none") != 0 &&
      hyper_param.validate_set_file.empty() && 
      hyper_param.valid_dataset == nullptr &&
      !hyper_param.cross_validation) {
    Color::print_warning(
      StringPrintf("Validation file not found, xLearn has already "
                   "disable (-x %s) option.", 
                   hyper_param.metric.c_str())
    );
    hyper_param.metric = "none";
  }
  if (hyper_param.loss_func.compare("squared") == 0) {
    if (hyper_param.metric.compare("acc") == 0 ||
        hyper_param.metric.compare("prec") == 0 ||
        hyper_param.metric.compare("recall") == 0 ||
        hyper_param.metric.compare("f1") == 0) {
      Color::print_warning(
        StringPrintf("The -x: %s metric can only be used "
                     "in classification tasks. xLearn will "
                     "ignore this option.",
                     hyper_param.metric.c_str())
      );
      hyper_param.metric = "none";
    }
  } else if (hyper_param.loss_func.compare("cross-entropy") == 0) {
    if (hyper_param.metric.compare("mae") == 0 ||
        hyper_param.metric.compare("mape") == 0 ||
        hyper_param.metric.compare("rmsd") == 0 ||
        hyper_param.metric.compare("rmse") == 0) {
      Color::print_warning(
        StringPrintf("The -x: %s metric can only be used "
                     "in regression tasks. xLearn will ignore "
                     "this option.",
                     hyper_param.metric.c_str())
      );
      hyper_param.metric = "none";
    }
  }
}